

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O3

bool tinyusdz::tydra::EvaluateShaderAttribute<float>
               (Stage *stage,Shader *shader,string *attr_name,float *out_val,string *err,
               TimeCode timeCode)

{
  vtable_type *pvVar1;
  UsdPreviewSurface *pUVar2;
  float *pfVar3;
  long *plVar4;
  long *plVar5;
  Value outval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  storage_union local_78;
  undefined8 *local_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (out_val != (float *)0x0) {
    local_68 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_78.dynamic = (void *)0x0;
    pUVar2 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&shader->value,false);
    if (pUVar2 == (UsdPreviewSurface *)0x0) {
      if (err != (string *)0x0) {
        pvVar1 = (shader->value).v_.vtable;
        if (pvVar1 == (vtable_type *)0x0) {
          local_98.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
          local_98._M_string_length = 4;
          local_98.field_2._M_allocated_capacity._4_4_ =
               local_98.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          (*pvVar1->type_name)(&local_98);
        }
        ::std::operator+(&local_40,"Unsupported shader type: ",&local_98);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_40);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_50 = *plVar5;
          lStack_48 = plVar4[3];
          local_60 = &local_50;
        }
        else {
          local_50 = *plVar5;
          local_60 = (long *)*plVar4;
        }
        local_58 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_60);
        if (local_60 != &local_50) {
          operator_delete(local_60,local_50 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                   local_98.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
    else {
      ::std::__cxx11::string::compare((char *)attr_name);
      pfVar3 = tinyusdz::value::Value::as<float>((Value *)&local_78,false);
      if (pfVar3 == (float *)0x0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
      }
      else {
        *out_val = *pfVar3;
      }
    }
    if (local_68 != (undefined8 *)0x0) {
      (*(code *)local_68[4])(&local_78);
    }
  }
  return false;
}

Assistant:

bool EvaluateShaderAttribute(
  const Stage &stage,
  const Shader &shader, const std::string &attr_name,
  T * out_val,
  std::string *err,
  const value::TimeCode timeCode) {

  if (!out_val) {
    return false;
  }

  uint32_t tyid = value::TypeTraits<T>::type_id();
  value::Value outval;

  bool result = false;

  if (const auto *psurf = shader.value.as<UsdPreviewSurface>()) {
    result = EvaluateUsdPreviewSurfaceAttribute(stage, *psurf, attr_name, tyid, outval, err, timeCode);
    if (const auto pt = outval.as<T>()) {
      (*out_val) = (*pt);
    } else {
      if (err) {
        (*err) += "[InternalError] Type mismatch.\n";
      }
      return false;
    }
  } else {
    if (err) {
      (*err) += "Unsupported shader type: " + shader.value.type_name() + "\n";
    }
    return false;
  }

  return result;
}